

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCaseInstance::setupDefaultInputs
          (BuiltinGlFragCoordXYZCaseInstance *this)

{
  float vertices [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0xbf8000003f800000;
  uStack_10 = 0x3f8000003f800000;
  local_28 = 0x3f8000003f800000;
  uStack_20 = 0x3f8000003f000000;
  local_38 = 0xbf800000bf800000;
  uStack_30 = 0x3f8000003f000000;
  local_48 = 0x3f800000bf800000;
  uStack_40 = 0x3f80000000000000;
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,&local_48)
  ;
  return;
}

Assistant:

void BuiltinGlFragCoordXYZCaseInstance::setupDefaultInputs (void)
{
	const float		vertices[]		=
	{
		-1.0f,  1.0f,  0.0f, 1.0f,
		-1.0f, -1.0f,  0.5f, 1.0f,
		 1.0f,  1.0f,  0.5f, 1.0f,
		 1.0f, -1.0f,  1.0f, 1.0f,
	};

	addAttribute(0u, VK_FORMAT_R32G32B32A32_SFLOAT, deUint32(sizeof(float) * 4), 4, vertices);
}